

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O2

void cf_hc_reset(Curl_cfilter *cf,Curl_easy *data)

{
  uint uVar1;
  undefined4 *puVar2;
  
  puVar2 = (undefined4 *)cf->ctx;
  if (puVar2 != (undefined4 *)0x0) {
    cf_hc_baller_reset((cf_hc_baller *)(puVar2 + 10),data);
    cf_hc_baller_reset((cf_hc_baller *)(puVar2 + 0x16),data);
    *puVar2 = 0;
    puVar2[8] = 0;
    uVar1 = (data->set).happy_eyeballs_timeout;
    puVar2[0x23] = uVar1;
    puVar2[0x22] = uVar1 >> 1;
  }
  return;
}

Assistant:

static void cf_hc_reset(struct Curl_cfilter *cf, struct Curl_easy *data)
{
  struct cf_hc_ctx *ctx = cf->ctx;

  if(ctx) {
    cf_hc_baller_reset(&ctx->h3_baller, data);
    cf_hc_baller_reset(&ctx->h21_baller, data);
    ctx->state = CF_HC_INIT;
    ctx->result = CURLE_OK;
    ctx->hard_eyeballs_timeout_ms = data->set.happy_eyeballs_timeout;
    ctx->soft_eyeballs_timeout_ms = data->set.happy_eyeballs_timeout / 2;
  }
}